

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O1

int main(void)

{
  CustomServer server;
  server_interface<MsgType> local_200;
  undefined8 *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  blcl::net::server_interface<MsgType>::server_interface(&local_200,60000);
  local_200._vptr_server_interface = (_func_int **)&PTR__CustomServer_00120450;
  local_60 = &uStack_30;
  local_58 = 1;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0x3f800000;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 10;
  blcl::net::server_interface<MsgType>::start(&local_200);
  do {
    blcl::net::server_interface<MsgType>::update(&local_200,0xffffffffffffffff,true);
  } while( true );
}

Assistant:

int main() {
    CustomServer server(60000);
    server.start();

    while (1) {
        server.update();
    }

    return 0;
}